

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

_Bool Curl_ssl_getsessionid
                (Curl_easy *data,connectdata *conn,_Bool isProxy,void **ssl_sessionid,size_t *idsize
                ,int sockindex)

{
  byte bVar1;
  char *first;
  _Bool _Var2;
  int iVar3;
  ssl_primary_config *data_00;
  Curl_ssl_session *pCVar4;
  int local_8c;
  int port;
  char *name;
  ssl_primary_config *ssl_config;
  long *plStack_58;
  _Bool no_match;
  long *general_age;
  size_t i;
  Curl_ssl_session *check;
  int sockindex_local;
  size_t *idsize_local;
  void **ssl_sessionid_local;
  _Bool isProxy_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (isProxy) {
    data_00 = &conn->proxy_ssl_config;
    first = (conn->http_proxy).host.name;
    local_8c = conn->port;
  }
  else {
    data_00 = &conn->ssl_config;
    first = (conn->host).name;
    local_8c = conn->remote_port;
  }
  *ssl_sessionid = (void *)0x0;
  if (((conn->http_proxy).proxytype == '\x02') &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    bVar1 = (data->set).proxy_ssl.primary.field_0x71;
  }
  else {
    bVar1 = (data->set).ssl.primary.field_0x71;
  }
  if (((bVar1 >> 3 & 1) != 0) && ((data->state).session != (Curl_ssl_session *)0x0)) {
    if ((data->share == (Curl_share *)0x0) || ((data->share->specifier & 0x10) == 0)) {
      plStack_58 = &(data->state).sessionage;
    }
    else {
      plStack_58 = &data->share->sessionage;
    }
    for (general_age = (long *)0x0; general_age < (long *)(data->set).general_ssl.max_ssl_sessions;
        general_age = (long *)((long)general_age + 1)) {
      pCVar4 = (data->state).session + (long)general_age;
      if (((((pCVar4->sessionid != (void *)0x0) &&
            (iVar3 = Curl_strcasecompare(first,pCVar4->name), iVar3 != 0)) &&
           ((((*(uint *)&(conn->bits).field_0x4 >> 9 & 1) == 0 &&
             (pCVar4->conn_to_host == (char *)0x0)) ||
            ((((*(uint *)&(conn->bits).field_0x4 >> 9 & 1) != 0 &&
              (pCVar4->conn_to_host != (char *)0x0)) &&
             (iVar3 = Curl_strcasecompare((conn->conn_to_host).name,pCVar4->conn_to_host),
             iVar3 != 0)))))) &&
          ((((*(uint *)&(conn->bits).field_0x4 >> 10 & 1) == 0 && (pCVar4->conn_to_port == -1)) ||
           (((*(uint *)&(conn->bits).field_0x4 >> 10 & 1) != 0 &&
            ((pCVar4->conn_to_port != -1 && (conn->conn_to_port == pCVar4->conn_to_port)))))))) &&
         ((local_8c == pCVar4->remote_port &&
          ((iVar3 = Curl_strcasecompare(conn->handler->scheme,pCVar4->scheme), iVar3 != 0 &&
           (_Var2 = Curl_ssl_config_matches(data_00,&pCVar4->ssl_config), _Var2)))))) {
        *plStack_58 = *plStack_58 + 1;
        pCVar4->age = *plStack_58;
        *ssl_sessionid = pCVar4->sessionid;
        if (idsize != (size_t *)0x0) {
          *idsize = pCVar4->idsize;
        }
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool Curl_ssl_getsessionid(struct Curl_easy *data,
                           struct connectdata *conn,
                           const bool isProxy,
                           void **ssl_sessionid,
                           size_t *idsize, /* set 0 if unknown */
                           int sockindex)
{
  struct Curl_ssl_session *check;
  size_t i;
  long *general_age;
  bool no_match = TRUE;

#ifndef CURL_DISABLE_PROXY
  struct ssl_primary_config * const ssl_config = isProxy ?
    &conn->proxy_ssl_config :
    &conn->ssl_config;
  const char * const name = isProxy ?
    conn->http_proxy.host.name : conn->host.name;
  int port = isProxy ? (int)conn->port : conn->remote_port;
#else
  /* no proxy support */
  struct ssl_primary_config * const ssl_config = &conn->ssl_config;
  const char * const name = conn->host.name;
  int port = conn->remote_port;
#endif
  (void)sockindex;
  *ssl_sessionid = NULL;

#ifdef CURL_DISABLE_PROXY
  if(isProxy)
    return TRUE;
#endif

  DEBUGASSERT(SSL_SET_OPTION(primary.sessionid));

  if(!SSL_SET_OPTION(primary.sessionid) || !data->state.session)
    /* session ID re-use is disabled or the session cache has not been
       setup */
    return TRUE;

  /* Lock if shared */
  if(SSLSESSION_SHARED(data))
    general_age = &data->share->sessionage;
  else
    general_age = &data->state.sessionage;

  for(i = 0; i < data->set.general_ssl.max_ssl_sessions; i++) {
    check = &data->state.session[i];
    if(!check->sessionid)
      /* not session ID means blank entry */
      continue;
    if(strcasecompare(name, check->name) &&
       ((!conn->bits.conn_to_host && !check->conn_to_host) ||
        (conn->bits.conn_to_host && check->conn_to_host &&
         strcasecompare(conn->conn_to_host.name, check->conn_to_host))) &&
       ((!conn->bits.conn_to_port && check->conn_to_port == -1) ||
        (conn->bits.conn_to_port && check->conn_to_port != -1 &&
         conn->conn_to_port == check->conn_to_port)) &&
       (port == check->remote_port) &&
       strcasecompare(conn->handler->scheme, check->scheme) &&
       Curl_ssl_config_matches(ssl_config, &check->ssl_config)) {
      /* yes, we have a session ID! */
      (*general_age)++;          /* increase general age */
      check->age = *general_age; /* set this as used in this age */
      *ssl_sessionid = check->sessionid;
      if(idsize)
        *idsize = check->idsize;
      no_match = FALSE;
      break;
    }
  }

  DEBUGF(infof(data, "%s Session ID in cache for %s %s://%s:%d",
               no_match? "Didn't find": "Found",
               isProxy ? "proxy" : "host",
               conn->handler->scheme, name, port));
  return no_match;
}